

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_arithmetic.c
# Opt level: O0

void * clip_new(t_floatarg f1,t_floatarg f2)

{
  t_object *owner;
  t_clip_conflict *x;
  t_floatarg f2_local;
  t_floatarg f1_local;
  
  owner = (t_object *)pd_new(clip_class);
  floatinlet_new(owner,(t_float *)((long)&owner[1].te_g.g_pd + 4));
  floatinlet_new(owner,(t_float *)&owner[1].te_g.g_next);
  outlet_new(owner,&s_float);
  *(t_floatarg *)((long)&owner[1].te_g.g_pd + 4) = f1;
  *(t_floatarg *)&owner[1].te_g.g_next = f2;
  return owner;
}

Assistant:

static void *clip_new(t_floatarg f1, t_floatarg f2)
{
    t_clip *x = (t_clip *)pd_new(clip_class);
    floatinlet_new(&x->x_ob, &x->x_f2);
    floatinlet_new(&x->x_ob, &x->x_f3);
    outlet_new(&x->x_ob, &s_float);
    x->x_f2 = f1;
    x->x_f3 = f2;
    return (x);
}